

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_ffmpeg.c
# Opt level: O2

int decode_packet(input_handle *ih)

{
  int iVar1;
  int iVar2;
  
  iVar1 = avcodec_decode_audio4(ih->codec_context,ih->frame,&ih->got_frame,&ih->packet);
  if (iVar1 < 0) {
    fwrite("Error in decoder!\n",0x12,1,_stderr);
    iVar2 = iVar1;
  }
  else {
    iVar2 = (ih->packet).size;
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int
decode_packet(struct input_handle *ih)
{
	int ret = 0;
	ret = avcodec_decode_audio4(ih->codec_context, ih->frame,
	    &ih->got_frame, &ih->packet);
	if (ret < 0) {
		fprintf(stderr, "Error in decoder!\n");
		return ret;
	}

	return FFMIN(ret, ih->packet.size);
}